

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCommandArgumentGroup *group;
  pointer pcVar1;
  pointer pbVar2;
  pointer ppcVar3;
  cmTargetExport *name;
  char *destination;
  char *file_permissions;
  char *component;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  MessageLevel message;
  ostream *poVar7;
  string *psVar8;
  long lVar9;
  cmGlobalGenerator *pcVar10;
  cmExportSet *exportSet;
  cmTarget *pcVar11;
  cmInstallExportGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  pointer ppcVar12;
  string fname;
  string local_918;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string local_8c8;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_898 [6];
  ios_base local_838 [264];
  cmCAString exp;
  cmCAString filename;
  cmCAEnabler exportOld;
  cmCAString name_space;
  cmInstallCommandArguments ica;
  
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8c8,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  cmCAString::cmCAString(&exp,&ica.Parser,"EXPORT",(cmCommandArgumentGroup *)0x0);
  group = &ica.ArgumentGroup;
  cmCAString::cmCAString(&name_space,&ica.Parser,"NAMESPACE",group);
  cmCAEnabler::cmCAEnabler(&exportOld,&ica.Parser,"EXPORT_LINK_INTERFACE_LIBRARIES",group);
  cmCAString::cmCAString(&filename,&ica.Parser,"FILE",group);
  cmCommandArgument::Follows(&exp.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(group,&exp.super_cmCommandArgument);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmInstallCommandArguments::Parse(&ica,args,&unknownArgs);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar4) {
      psVar8 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar8->_M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," given no DESTINATION!",0x16);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&fname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fname._M_dataplus._M_p != &fname.field_2) {
          operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001fb9ec;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename.String._M_dataplus._M_p,
                 filename.String._M_dataplus._M_p + filename.String._M_string_length);
      lVar9 = std::__cxx11::string::find_first_of((char *)&fname,0x49fd94,0);
      if (lVar9 == -1) {
        if (fname._M_string_length != 0) {
          cmsys::SystemTools::GetFilenameLastExtension((string *)&e,&fname);
          iVar5 = std::__cxx11::string::compare((char *)&e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != local_898) {
            operator_delete(_e,local_898[0]._M_allocated_capacity + 1);
          }
          if (iVar5 == 0) {
            if (fname._M_string_length == 0) goto LAB_001fbe0c;
            goto LAB_001fbf30;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," given invalid export file name \"",0x21);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,fname._M_dataplus._M_p,fname._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"The FILE argument must specify a name ending in \".cmake\".",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_918);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_918._M_dataplus._M_p != &local_918.field_2) {
            operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001fbb48;
        }
LAB_001fbe0c:
        std::__cxx11::string::_M_assign((string *)&fname);
        std::__cxx11::string::append((char *)&fname);
        lVar9 = std::__cxx11::string::find_first_of((char *)&fname,0x49fd94,0);
        if (lVar9 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," given export name \"",0x14);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,exp.String._M_dataplus._M_p,exp.String._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"This name cannot be safely converted to a file name.  ",0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"Specify a different export name or use the FILE option to set ",0x3e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"a file name explicitly.",0x17);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_918);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_918._M_dataplus._M_p != &local_918.field_2) {
            operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001fbb48;
        }
LAB_001fbf30:
        pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        exportSet = cmExportSetMap::operator[](&pcVar10->ExportSets,&exp.String);
        if (exportOld.Enabled == true) {
          ppcVar3 = (exportSet->TargetExports).
                    super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (ppcVar12 = (exportSet->TargetExports).
                          super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
                          _M_impl.super__Vector_impl_data._M_start; ppcVar12 != ppcVar3;
              ppcVar12 = ppcVar12 + 1) {
            name = *ppcVar12;
            pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
            pcVar11 = cmGlobalGenerator::FindTarget(pcVar10,&name->TargetName,false);
            if (pcVar11 == (cmTarget *)0x0) {
LAB_001fc088:
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"INSTALL(EXPORT) given keyword \"",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"\", but target \"",0xf);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&e,(name->TargetName)._M_dataplus._M_p,
                                  (name->TargetName)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\" does not have policy CMP0022 set to NEW.",0x2a);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_918);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_918._M_dataplus._M_p != &local_918.field_2) {
                operator_delete(local_918._M_dataplus._M_p,
                                local_918.field_2._M_allocated_capacity + 1);
              }
              goto LAB_001fbb48;
            }
            PVar6 = cmPolicies::PolicyMap::Get(&pcVar11->PolicyMap,CMP0022);
            if ((PVar6 == WARN) ||
               (PVar6 = cmPolicies::PolicyMap::Get(&pcVar11->PolicyMap,CMP0022), PVar6 == OLD))
            goto LAB_001fc088;
          }
        }
        message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
        this_00 = (cmInstallExportGenerator *)operator_new(0x178);
        psVar8 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        destination = (psVar8->_M_dataplus)._M_p;
        psVar8 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        file_permissions = (psVar8->_M_dataplus)._M_p;
        configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        psVar8 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        component = (psVar8->_M_dataplus)._M_p;
        bVar4 = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        cmInstallExportGenerator::cmInstallExportGenerator
                  (this_00,exportSet,destination,file_permissions,configurations,component,message,
                   bVar4,fname._M_dataplus._M_p,name_space.String._M_dataplus._M_p,exportOld.Enabled
                   ,false);
        bVar4 = true;
        cmMakefile::AddInstallGenerator
                  ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_00);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," given invalid export file name \"",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,fname._M_dataplus._M_p,fname._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"The FILE argument may not contain a path.  ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"Specify the path in the DESTINATION argument.",0x2d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_918);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918._M_dataplus._M_p != &local_918.field_2) {
          operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
        }
LAB_001fbb48:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_838);
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001fbb8a;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," given unknown argument \"",0x19);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,((unknownArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (unknownArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&fname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
    }
LAB_001fb9ec:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_838);
  }
  bVar4 = false;
LAB_001fbb8a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  filename.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005ebcb0
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename.String._M_dataplus._M_p != &filename.String.field_2) {
    operator_delete(filename.String._M_dataplus._M_p,
                    filename.String.field_2._M_allocated_capacity + 1);
  }
  filename.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005e6578;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&filename.super_cmCommandArgument.ArgumentsBefore._M_t);
  exportOld.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005e6578;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exportOld.super_cmCommandArgument.ArgumentsBefore._M_t);
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_005ebcb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space.String._M_dataplus._M_p != &name_space.String.field_2) {
    operator_delete(name_space.String._M_dataplus._M_p,
                    name_space.String.field_2._M_allocated_capacity + 1);
  }
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005e6578;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&name_space.super_cmCommandArgument.ArgumentsBefore._M_t);
  exp.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005ebcb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp.String._M_dataplus._M_p != &exp.String.field_2) {
    operator_delete(exp.String._M_dataplus._M_p,exp.String.field_2._M_allocated_capacity + 1);
  }
  exp.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005e6578;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exp.super_cmCommandArgument.ArgumentsBefore._M_t);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  return bVar4;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(nullptr);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Check the file name.
  std::string fname = filename.GetString();
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = exp.GetString();
    fname += ".cmake";

    if (fname.find_first_of(":/\\") != std::string::npos) {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp.GetString() << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
    }
  }

  cmExportSet* exportSet =
    this->Makefile->GetGlobalGenerator()->GetExportSets()[exp.GetString()];
  if (exportOld.IsEnabled()) {
    for (cmTargetExport* te : *exportSet->GetTargetExports()) {
      cmTarget* tgt =
        this->Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES"
          << "\", but target \"" << te->TargetName
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator = new cmInstallExportGenerator(
    exportSet, ica.GetDestination().c_str(), ica.GetPermissions().c_str(),
    ica.GetConfigurations(), ica.GetComponent().c_str(), message,
    ica.GetExcludeFromAll(), fname.c_str(), name_space.GetCString(),
    exportOld.IsEnabled(), false);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}